

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O0

xmlEnumerationPtr xmlCreateEnumeration(xmlChar *name)

{
  xmlChar *pxVar1;
  xmlEnumerationPtr ret;
  xmlChar *name_local;
  
  name_local = (xmlChar *)(*xmlMalloc)(0x10);
  if (name_local == (xmlChar *)0x0) {
    name_local = (xmlChar *)0x0;
  }
  else {
    memset(name_local,0,0x10);
    if (name != (xmlChar *)0x0) {
      pxVar1 = xmlStrdup(name);
      *(xmlChar **)(name_local + 8) = pxVar1;
      if (*(long *)(name_local + 8) == 0) {
        (*xmlFree)(name_local);
        name_local = (xmlChar *)0x0;
      }
    }
  }
  return (xmlEnumerationPtr)name_local;
}

Assistant:

xmlEnumerationPtr
xmlCreateEnumeration(const xmlChar *name) {
    xmlEnumerationPtr ret;

    ret = (xmlEnumerationPtr) xmlMalloc(sizeof(xmlEnumeration));
    if (ret == NULL)
        return(NULL);
    memset(ret, 0, sizeof(xmlEnumeration));

    if (name != NULL) {
        ret->name = xmlStrdup(name);
        if (ret->name == NULL) {
            xmlFree(ret);
            return(NULL);
        }
    }

    return(ret);
}